

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.h
# Opt level: O1

uint32_t __thiscall spvtools::opt::Module::TakeNextIdBound(Module *this)

{
  uint uVar1;
  uint32_t uVar2;
  
  uVar1 = (this->header_).bound;
  if (this->context_ == (IRContext *)0x0) {
    if (0x3ffffe < uVar1) {
      return 0;
    }
  }
  else if (this->context_->max_id_bound_ <= uVar1) {
    return 0;
  }
  uVar2 = (this->header_).bound;
  (this->header_).bound = uVar2 + 1;
  return uVar2;
}

Assistant:

IRContext* context() const { return context_; }